

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall Js::InterpreterStackFrame::RestoreSp(InterpreterStackFrame *this)

{
  ulong *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong *puVar5;
  
  puVar5 = *(ulong **)(this + 0x38);
  if (puVar5 == (ulong *)0x0) {
    ResetOut(this);
    return;
  }
  if (*(ulong **)(this + 0x30) <= puVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x991,"(m_outSpCached < m_outSp)","m_outSpCached < m_outSp");
    if (!bVar3) goto LAB_0096ed62;
    *puVar4 = 0;
    puVar5 = *(ulong **)(this + 0x38);
  }
  *(ulong **)(this + 0x30) = puVar5;
  puVar1 = (ulong *)*puVar5;
  *(ulong **)(this + 0x38) = puVar1;
  if (puVar5 < puVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x995,"(m_outSpCached == nullptr || m_outSpCached <= m_outSp)",
                                "m_outSpCached == nullptr || m_outSpCached <= m_outSp");
    if (!bVar3) {
LAB_0096ed62:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    puVar5 = *(ulong **)(this + 0x30);
  }
  *(ulong *)(this + 0x28) = puVar5[1];
  return;
}

Assistant:

inline void InterpreterStackFrame::RestoreSp()
    {
        // This will be called in the Finally block to restore from the previous SP cached.

        // m_outSpCached can be null if the catch block is called.
        if (m_outSpCached != nullptr)
        {
            Assert(m_outSpCached < m_outSp);
            m_outSp = m_outSpCached;

            m_outSpCached = (Var*)*m_outSp;
            Assert(m_outSpCached == nullptr || m_outSpCached <= m_outSp);

            m_outParams = (Var*)*(m_outSp + 1);
        }
        else
        {
            ResetOut();
        }
    }